

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O2

void printOperand(MCInst *MI,int OpNum,SStream *O)

{
  anon_union_1480_8_3a70395c_for_cs_detail_6 *paVar1;
  uint8_t *puVar2;
  byte bVar3;
  cs_detail *pcVar4;
  _Bool _Var5;
  uint uVar6;
  MCOperand *op;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  
  if ((int)(uint)MI->size <= OpNum) {
    return;
  }
  op = MCInst_getOperand(MI,OpNum);
  _Var5 = MCOperand_isReg(op);
  if (_Var5) {
    uVar6 = MCOperand_getReg(op);
    SStream_concat0(O,getRegisterName_AsmStrs +
                      *(uint *)(getRegisterName_RegAsmOffset + (ulong)(uVar6 - 1) * 4));
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar4 = MI->flat_insn->detail;
    bVar3 = (pcVar4->field_6).x86.prefix[0];
    if (MI->csh->doing_mem == true) {
      lVar8 = (ulong)bVar3 * 0x10;
      if (pcVar4->groups[lVar8 + 0x16] != '\0') {
        pcVar4->groups[lVar8 + 0x17] = (uint8_t)uVar6;
        return;
      }
      pcVar4->groups[lVar8 + 0x16] = (uint8_t)uVar6;
      return;
    }
    puVar2 = pcVar4->groups + (ulong)bVar3 * 0x10 + 0x12;
    puVar2[0] = '\x01';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
  }
  else {
    _Var5 = MCOperand_isImm(op);
    if (!_Var5) {
      return;
    }
    uVar7 = MCOperand_getImm(op);
    uVar6 = (uint)uVar7;
    if ((int)uVar6 < 0) {
      uVar7 = (ulong)-uVar6;
      if (uVar6 < 0xfffffff7) {
        pcVar9 = "-0x%x";
      }
      else {
        pcVar9 = "-%u";
      }
    }
    else {
      if (uVar6 < 10) {
        pcVar9 = ", %u";
      }
      else {
        pcVar9 = ", 0x%x";
      }
      pcVar9 = pcVar9 + 2;
      uVar7 = uVar7 & 0xffffffff;
    }
    SStream_concat(O,pcVar9,uVar7);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar4 = MI->flat_insn->detail;
    bVar3 = (pcVar4->field_6).x86.prefix[0];
    if (MI->csh->doing_mem == true) {
      *(uint *)(pcVar4->groups + (ulong)bVar3 * 0x10 + 0x1a) = uVar6;
      return;
    }
    puVar2 = pcVar4->groups + (ulong)bVar3 * 0x10 + 0x12;
    puVar2[0] = '\x02';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
  }
  pcVar4 = MI->flat_insn->detail;
  *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x16) = uVar6;
  paVar1 = &MI->flat_insn->detail->field_6;
  (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
  return;
}

Assistant:

static void printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isReg(Op)) {
		unsigned reg = MCOperand_getReg(Op);
#ifndef CAPSTONE_DIET
		char *RegName = getRegisterName(reg);
#endif
		// map to public register
		reg = PPC_map_register(reg);
#ifndef CAPSTONE_DIET
		// The linux and AIX assembler does not take register prefixes.
		if (MI->csh->syntax == CS_OPT_SYNTAX_NOREGNAME)
			RegName = stripRegisterPrefix(RegName);

		SStream_concat0(O, RegName);
#endif

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].mem.base = reg;
			} else {
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_REG;
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].reg = reg;
				MI->flat_insn->detail->ppc.op_count++;
			}
		}

		return;
	}

	if (MCOperand_isImm(Op)) {
		int32_t imm = (int32_t)MCOperand_getImm(Op);
		if (imm >= 0) {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%x", imm);
			else
				SStream_concat(O, "%u", imm);
		} else {
			if (imm < -HEX_THRESHOLD)
				SStream_concat(O, "-0x%x", -imm);
			else
				SStream_concat(O, "-%u", -imm);
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].mem.disp = imm;
			} else {
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = imm;
				MI->flat_insn->detail->ppc.op_count++;
			}
		}
	}
}